

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int rffti1_(int *n,double *wa,double *fac)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *in_RDX;
  long in_RSI;
  int *in_RDI;
  double dVar5;
  double dVar6;
  double dVar7;
  double argld;
  int ntry;
  double argh;
  int nfm1;
  double tpi;
  int ipm;
  int ido;
  double arg;
  int nr;
  int nq;
  int is;
  int nl;
  int ip;
  int nf;
  int ii;
  int ld;
  double fi;
  int ib;
  int l2;
  int l1;
  int k1;
  int j;
  int i__;
  int i__3;
  int i__2;
  int i__1;
  int ntryh [4];
  int local_b4;
  int local_80;
  int local_7c;
  int local_74;
  int local_70;
  int local_6c;
  double local_68;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_38 [6];
  double *local_20;
  long local_18;
  int *local_10;
  
  local_38[0] = 4;
  local_38[1] = 2;
  local_38[2] = 3;
  local_38[3] = 5;
  local_18 = in_RSI + -8;
  local_20 = in_RDX + -1;
  local_7c = *in_RDI;
  local_74 = 0;
  local_4c = 0;
  do {
    iVar2 = local_4c + 1;
    iVar4 = local_74;
    if (local_4c + -3 < 1) {
      local_b4 = local_38[local_4c];
    }
    else {
      local_b4 = local_b4 + 2;
    }
    while (local_74 = iVar4, iVar3 = local_7c / local_b4, local_4c = iVar2,
          local_7c == local_b4 * iVar3) {
      iVar4 = local_74 + 1;
      local_20[local_74 + 3] = (double)local_b4;
      if ((local_b4 == 2) && (iVar4 != 1)) {
        for (local_48 = 2; local_48 <= iVar4; local_48 = local_48 + 1) {
          local_20[(iVar4 - local_48) + 4] = local_20[(iVar4 - local_48) + 3];
        }
        in_RDX[2] = 2.0;
      }
      local_7c = iVar3;
      if (iVar3 == 1) {
        *in_RDX = (double)*in_RDI;
        in_RDX[1] = (double)iVar4;
        local_10 = in_RDI;
        dVar5 = atan(1.0);
        iVar4 = *local_10;
        local_80 = 0;
        local_54 = 1;
        if (local_74 != 0) {
          for (local_50 = 1; local_50 <= local_74; local_50 = local_50 + 1) {
            dVar1 = local_20[local_50 + 2];
            local_6c = 0;
            iVar2 = local_54 * (int)dVar1;
            iVar3 = *local_10 / iVar2;
            for (local_4c = 1; local_4c <= (int)dVar1 + -1; local_4c = local_4c + 1) {
              local_6c = local_54 + local_6c;
              local_48 = local_80;
              local_68 = 0.0;
              for (local_70 = 3; local_70 <= iVar3; local_70 = local_70 + 2) {
                local_68 = local_68 + 1.0;
                dVar6 = local_68 * (double)local_6c * ((dVar5 * 8.0) / (double)iVar4);
                dVar7 = cos(dVar6);
                *(double *)(local_18 + (long)(local_48 + 1) * 8) = dVar7;
                dVar6 = sin(dVar6);
                *(double *)(local_18 + (long)(local_48 + 2) * 8) = dVar6;
                local_48 = local_48 + 2;
              }
              local_80 = iVar3 + local_80;
            }
            local_54 = iVar2;
          }
        }
        return 0;
      }
    }
  } while( true );
}

Assistant:

int rffti1_(int *n, fft_real_t *wa, fft_real_t *fac)
{
    /* Initialized data */

     int ntryh[4] = { 4,2,3,5 };

    /* System generated locals */
    int i__1, i__2, i__3;

    /* Builtin functions */

    /* Local variables */
     int i__, j, k1, l1, l2, ib;
     fft_real_t fi;
     int ld, ii, nf, ip, nl, is, nq, nr;
     fft_real_t arg;
     int ido, ipm;
     fft_real_t tpi;
     int nfm1;
     fft_real_t argh;
     int ntry;
     fft_real_t argld;

    /* Parameter adjustments */
    --wa;
    --fac;

    /* Function Body */

    nl = *n;
    nf = 0;
    j = 0;
L101:
    ++j;
    if (j - 4 <= 0) {
	goto L102;
    } else {
	goto L103;
    }
L102:
    ntry = ntryh[j - 1];
    goto L104;
L103:
    ntry += 2;
L104:
    nq = nl / ntry;
    nr = nl - ntry * nq;
    if (nr != 0) {
	goto L101;
    } else {
	goto L105;
    }
L105:
    ++nf;
    fac[nf + 2] = (fft_real_t) ntry;
    nl = nq;
    if (ntry != 2) {
	goto L107;
    }
    if (nf == 1) {
	goto L107;
    }
    i__1 = nf;
    for (i__ = 2; i__ <= i__1; ++i__) {
	ib = nf - i__ + 2;
	fac[ib + 2] = fac[ib + 1];
/* L106: */
    }
    fac[3] = 2.0;
L107:
    if (nl != 1) {
	goto L104;
    }
    fac[1] = (fft_real_t) (*n);
    fac[2] = (fft_real_t) nf;
    tpi = atan(1.) * 8.;
    argh = tpi / (fft_real_t) (*n);
    is = 0;
    nfm1 = nf - 1;
    l1 = 1;
    if (nfm1 == 0) {
	return 0;
    }
    i__1 = nfm1;
    for (k1 = 1; k1 <= i__1; ++k1) {
	ip = fac[k1 + 2];
	ld = 0;
	l2 = l1 * ip;
	ido = *n / l2;
	ipm = ip - 1;
	i__2 = ipm;
	for (j = 1; j <= i__2; ++j) {
	    ld += l1;
	    i__ = is;
	    argld = (fft_real_t) ld * argh;
	    fi = 0.0;
	    i__3 = ido;
	    for (ii = 3; ii <= i__3; ii += 2) {
		i__ += 2;
		fi += 1.0;
		arg = fi * argld;
		wa[i__ - 1] = cos(arg);
		wa[i__] = sin(arg);
/* L108: */
	    }
	    is += ido;
/* L109: */
	}
	l1 = l2;
/* L110: */
    }
    return 0;
}